

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O1

BigInt<unsigned_int,_unsigned_long> *
scp::operator<<(BigInt<unsigned_int,_unsigned_long> *__return_storage_ptr__,
               BigInt<unsigned_int,_unsigned_long> *x,uint64_t y)

{
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&__return_storage_ptr__->_values,&x->_values);
  __return_storage_ptr__->_positive = x->_positive;
  BigInt<unsigned_int,_unsigned_long>::operator<<=(__return_storage_ptr__,y);
  return __return_storage_ptr__;
}

Assistant:

constexpr BigInt<TBase, TBuffer> operator<<(const BigInt<TBase, TBuffer>& x, uint64_t y)
	{
		BigInt<TBase, TBuffer> z(x);
		z <<= y;
		return z;
	}